

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec.cc
# Opt level: O2

int pkey_ec_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  
  iVar3 = pkey_ec_init(dst);
  if (iVar3 != 0) {
    puVar1 = (undefined8 *)dst->data;
    uVar2 = *(undefined8 *)((long)src->data + 8);
    *puVar1 = *src->data;
    puVar1[1] = uVar2;
  }
  return (uint)(iVar3 != 0);
}

Assistant:

static int pkey_ec_copy(EVP_PKEY_CTX *dst, EVP_PKEY_CTX *src) {
  if (!pkey_ec_init(dst)) {
    return 0;
  }

  const EC_PKEY_CTX *sctx = reinterpret_cast<EC_PKEY_CTX *>(src->data);
  EC_PKEY_CTX *dctx = reinterpret_cast<EC_PKEY_CTX *>(dst->data);
  dctx->md = sctx->md;
  dctx->gen_group = sctx->gen_group;
  return 1;
}